

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O2

void for_all_record_sizes(char *filename_fmt,_func_void_int_char_ptr_char_ptr *tests)

{
  uint uVar1;
  long lVar2;
  char description [14];
  char filename [500];
  
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    uVar1 = *(uint *)((long)&DAT_00106418 + lVar2);
    snprintf(filename,500,filename_fmt,(ulong)uVar1);
    snprintf(description,0xe,"%i bit record",(ulong)uVar1);
    (*tests)(uVar1,filename,description);
  }
  return;
}

Assistant:

void for_all_record_sizes(const char *filename_fmt,
                          void (*tests)(int record_size,
                                        const char *filename,
                                        const char *description)) {
    int sizes[] = {24, 28, 32};
    for (int i = 0; i < 3; i++) {
        int size = sizes[i];

        char filename[500];
#if defined(__clang__)
// This warning seems ok to ignore here in the tests.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
        snprintf(filename, 500, filename_fmt, size);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif

        char description[14];
        snprintf(description, 14, "%i bit record", size);

        tests(size, filename, description);
    }
}